

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalUnixMakefileGenerator3.cxx
# Opt level: O1

void __thiscall
cmGlobalUnixMakefileGenerator3::InitializeProgressMarks(cmGlobalUnixMakefileGenerator3 *this)

{
  cmGeneratorTarget *this_00;
  bool bVar1;
  TargetType TVar2;
  _Rb_tree<cmGeneratorTarget_const*,cmGeneratorTarget_const*,std::_Identity<cmGeneratorTarget_const*>,std::less<cmGeneratorTarget_const*>,std::allocator<cmGeneratorTarget_const*>>
  *this_01;
  TargetDependSet *pTVar3;
  _Rb_tree_node_base *p_Var4;
  pointer ppcVar5;
  cmGeneratorTarget *gt;
  vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> targets;
  Snapshot csnp;
  Snapshot tsnp;
  cmGeneratorTarget *local_e8;
  pointer local_e0;
  vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> local_d8;
  string local_c0;
  pointer local_a0;
  cmLocalGenerator *local_98;
  cmLocalGenerator *local_90;
  map<cmState::Snapshot,_std::set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>,_cmState::Snapshot::StrictWeakOrder,_std::allocator<std::pair<const_cmState::Snapshot,_std::set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>_>_>_>
  *local_88;
  Snapshot local_80;
  Snapshot local_68;
  Snapshot local_48;
  
  local_88 = &this->DirectoryTargetsMap;
  std::
  _Rb_tree<cmState::Snapshot,_std::pair<const_cmState::Snapshot,_std::set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>_>,_std::_Select1st<std::pair<const_cmState::Snapshot,_std::set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>_>_>,_cmState::Snapshot::StrictWeakOrder,_std::allocator<std::pair<const_cmState::Snapshot,_std::set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>_>_>_>
  ::clear(&local_88->_M_t);
  local_a0 = (this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.LocalGenerators.
             super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  if (local_a0 !=
      (this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.LocalGenerators.
      super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      local_98 = *local_a0;
      std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::vector
                (&local_d8,&local_98->GeneratorTargets);
      for (ppcVar5 = local_d8.
                     super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
                     _M_impl.super__Vector_impl_data._M_start;
          ppcVar5 !=
          local_d8.super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
          _M_impl.super__Vector_impl_data._M_finish; ppcVar5 = ppcVar5 + 1) {
        local_e8 = *ppcVar5;
        local_90 = cmGeneratorTarget::GetLocalGenerator(local_e8);
        TVar2 = cmGeneratorTarget::GetType(local_e8);
        this_00 = local_e8;
        bVar1 = true;
        local_e0 = ppcVar5;
        if (TVar2 != INTERFACE_LIBRARY) {
          local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"EXCLUDE_FROM_ALL","")
          ;
          bVar1 = cmGeneratorTarget::GetPropertyAsBool(this_00,&local_c0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
            operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
          }
        }
        ppcVar5 = local_e0;
        if (bVar1 == false) {
          cmLocalGenerator::GetStateSnapshot(&local_68,local_98);
          cmLocalGenerator::GetStateSnapshot(&local_48,local_90);
          while ((bVar1 = cmState::Snapshot::IsValid(&local_68), bVar1 &&
                 (bVar1 = cmGlobalGenerator::IsExcluded
                                    ((cmGlobalGenerator *)this,&local_68,&local_48), !bVar1))) {
            this_01 = (_Rb_tree<cmGeneratorTarget_const*,cmGeneratorTarget_const*,std::_Identity<cmGeneratorTarget_const*>,std::less<cmGeneratorTarget_const*>,std::allocator<cmGeneratorTarget_const*>>
                       *)std::
                         map<cmState::Snapshot,_std::set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>,_cmState::Snapshot::StrictWeakOrder,_std::allocator<std::pair<const_cmState::Snapshot,_std::set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>_>_>_>
                         ::operator[](local_88,&local_68);
            std::
            _Rb_tree<cmGeneratorTarget_const*,cmGeneratorTarget_const*,std::_Identity<cmGeneratorTarget_const*>,std::less<cmGeneratorTarget_const*>,std::allocator<cmGeneratorTarget_const*>>
            ::_M_insert_unique<cmGeneratorTarget_const*const&>(this_01,&local_e8);
            pTVar3 = cmGlobalGenerator::GetTargetDirectDepends((cmGlobalGenerator *)this,local_e8);
            for (p_Var4 = (pTVar3->
                          super_set<cmTargetDepend,_std::less<cmTargetDepend>,_std::allocator<cmTargetDepend>_>
                          )._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
                (_Rb_tree_header *)p_Var4 !=
                &(pTVar3->
                 super_set<cmTargetDepend,_std::less<cmTargetDepend>,_std::allocator<cmTargetDepend>_>
                 )._M_t._M_impl.super__Rb_tree_header;
                p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4)) {
              local_80.State = *(cmState **)(p_Var4 + 1);
              std::
              _Rb_tree<cmGeneratorTarget_const*,cmGeneratorTarget_const*,std::_Identity<cmGeneratorTarget_const*>,std::less<cmGeneratorTarget_const*>,std::allocator<cmGeneratorTarget_const*>>
              ::_M_insert_unique<cmGeneratorTarget_const*>(this_01,(cmGeneratorTarget **)&local_80);
            }
            cmState::Snapshot::GetBuildsystemDirectoryParent(&local_80,&local_68);
            local_68.State = local_80.State;
            ppcVar5 = local_e0;
          }
        }
      }
      if (local_d8.super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_d8.
                        super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_d8.
                              super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_d8.
                              super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      local_a0 = local_a0 + 1;
    } while (local_a0 !=
             (this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.LocalGenerators.
             super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  return;
}

Assistant:

void cmGlobalUnixMakefileGenerator3::InitializeProgressMarks()
{
  this->DirectoryTargetsMap.clear();
  // Loop over all targets in all local generators.
  for(std::vector<cmLocalGenerator*>::const_iterator
        lgi = this->LocalGenerators.begin();
      lgi != this->LocalGenerators.end(); ++lgi)
    {
    cmLocalGenerator* lg = *lgi;
    std::vector<cmGeneratorTarget*> targets = lg->GetGeneratorTargets();
    for(std::vector<cmGeneratorTarget*>::const_iterator t = targets.begin();
        t != targets.end(); ++t)
      {
      cmGeneratorTarget* gt = *t;

      cmLocalGenerator* tlg = gt->GetLocalGenerator();

      if(gt->GetType() == cmState::INTERFACE_LIBRARY
          || gt->GetPropertyAsBool("EXCLUDE_FROM_ALL"))
        {
        continue;
        }

      cmState::Snapshot csnp = lg->GetStateSnapshot();
      cmState::Snapshot tsnp = tlg->GetStateSnapshot();

      // Consider the directory containing the target and all its
      // parents until something excludes the target.
      for( ; csnp.IsValid() && !this->IsExcluded(csnp, tsnp);
          csnp = csnp.GetBuildsystemDirectoryParent())
        {
        // This local generator includes the target.
        std::set<cmGeneratorTarget const*>& targetSet =
          this->DirectoryTargetsMap[csnp];
        targetSet.insert(gt);

        // Add dependencies of the included target.  An excluded
        // target may still be included if it is a dependency of a
        // non-excluded target.
        TargetDependSet const& tgtdeps = this->GetTargetDirectDepends(gt);
        for(TargetDependSet::const_iterator ti = tgtdeps.begin();
            ti != tgtdeps.end(); ++ti)
          {
          targetSet.insert(*ti);
          }
        }
      }
    }
}